

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.h
# Opt level: O0

void __thiscall BamTools::BamAlignment::BamAlignment(BamAlignment *this,BamAlignment *param_2)

{
  undefined8 uVar1;
  string *in_RSI;
  string *in_RDI;
  BamAlignmentSupportData *this_00;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x28,in_RSI + 0x28);
  std::__cxx11::string::string(in_RDI + 0x48,in_RSI + 0x48);
  std::__cxx11::string::string(in_RDI + 0x68,in_RSI + 0x68);
  std::__cxx11::string::string(in_RDI + 0x88,in_RSI + 0x88);
  uVar1 = *(undefined8 *)(in_RSI + 0xb0);
  *(undefined8 *)(in_RDI + 0xa8) = *(undefined8 *)(in_RSI + 0xa8);
  *(undefined8 *)(in_RDI + 0xb0) = uVar1;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)in_RSI,
             in_stack_ffffffffffffffe8);
  *(undefined4 *)(in_RDI + 0xd8) = *(undefined4 *)(in_RSI + 0xd8);
  *(undefined8 *)(in_RDI + 0xd0) = *(undefined8 *)(in_RSI + 0xd0);
  this_00 = (BamAlignmentSupportData *)(in_RDI + 0xe0);
  std::__cxx11::string::string((string *)this_00,in_RSI + 0xe0);
  BamAlignmentSupportData::BamAlignmentSupportData
            (this_00,(BamAlignmentSupportData *)(in_RDI + 0x100));
  std::__cxx11::string::string(in_RDI + 0x138,in_RSI + 0x138);
  return;
}

Assistant:

class API_EXPORT BamAlignment
{

    // constructors & destructor
public:
    BamAlignment();

    // queries against alignment flags
public:
    bool IsDuplicate() const;          // returns true if this read is a PCR duplicate
    bool IsFailedQC() const;           // returns true if this read failed quality control
    bool IsFirstMate() const;          // returns true if alignment is first mate on read
    bool IsMapped() const;             // returns true if alignment is mapped
    bool IsMateMapped() const;         // returns true if alignment's mate is mapped
    bool IsMateReverseStrand() const;  // returns true if alignment's mate mapped to reverse strand
    bool IsPaired() const;             // returns true if alignment part of paired-end read
    bool IsSupplementary() const;      // returns true if this read is supplementary
    bool IsPrimaryAlignment() const;   // returns true if reported position is primary alignment
    bool IsProperPair()
        const;  // returns true if alignment is part of read that satisfied paired-end resolution
    bool IsReverseStrand() const;  // returns true if alignment mapped to reverse strand
    bool IsSecondMate() const;     // returns true if alignment is second mate on read

    // manipulate alignment flags
public:
    void SetIsDuplicate(bool ok);   // sets value of "PCR duplicate" flag
    void SetIsFailedQC(bool ok);    // sets value of "failed quality control" flag
    void SetIsFirstMate(bool ok);   // sets value of "alignment is first mate" flag
    void SetIsMapped(bool ok);      // sets value of "alignment is mapped" flag
    void SetIsMateMapped(bool ok);  // sets value of "alignment's mate is mapped" flag
    void SetIsMateReverseStrand(
        bool ok);               // sets value of "alignment's mate mapped to reverse strand" flag
    void SetIsPaired(bool ok);  // sets value of "alignment part of paired-end read" flag
    void SetIsPrimaryAlignment(bool ok);  // sets value of "position is primary alignment" flag
    void SetIsProperPair(
        bool
            ok);  // sets value of "alignment is part of read that satisfied paired-end resolution" flag
    void SetIsReverseStrand(bool ok);  // sets value of "alignment mapped to reverse strand" flag
    void SetIsSecondMate(bool ok);     // sets value of "alignment is second mate on read" flag

    // tag data access methods
public:
    // add a new tag
    template <typename T>
    bool AddTag(const std::string& tag, const std::string& type, const T& value);
    template <typename T>
    bool AddTag(const std::string& tag, const std::vector<T>& values);

    // edit (or append) tag
    template <typename T>
    bool EditTag(const std::string& tag, const std::string& type, const T& value);
    template <typename T>
    bool EditTag(const std::string& tag, const std::vector<T>& values);

    // retrieves tag data
    template <typename T>
    bool GetTag(const std::string& tag, T& destination) const;
    template <typename T>
    bool GetTag(const std::string& tag, std::vector<T>& destination) const;

    // retrieves all current tag names
    std::vector<std::string> GetTagNames() const;

    // retrieves the SAM/BAM type-code for requested tag name
    bool GetTagType(const std::string& tag, char& type) const;

    // retrieves the SAM/BAM type-code for the data elements in an array tag
    bool GetArrayTagType(const std::string& tag, char& type) const;

    // returns true if alignment has a record for this tag name
    bool HasTag(const std::string& tag) const;

    // removes a tag
    void RemoveTag(const std::string& tag);

    // additional methods
public:
    // populates alignment string fields
    bool BuildCharData();

    // calculates alignment end position
    int GetEndPosition(bool usePadded = false, bool closedInterval = false) const;

    // returns a description of the last error that occurred
    std::string GetErrorString() const;

    // retrieves the size, read locations and reference locations of soft-clip operations
    bool GetSoftClips(std::vector<int>& clipSizes, std::vector<int>& readPositions,
                      std::vector<int>& genomePositions, bool usePadded = false) const;

    // public data fields
public:
    std::string Name;        // read name
    int32_t Length;          // length of query sequence
    std::string QueryBases;  // 'original' sequence (contained in BAM file)
    std::string
        AlignedBases;  // 'aligned' sequence (QueryBases plus deletion, padding, clipping chars)
    std::string Qualities;           // FASTQ qualities (ASCII characters, not numeric values)
    std::string TagData;             // tag data (use provided methods to query/modify)
    int32_t RefID;                   // ID number for reference sequence
    int32_t Position;                // position (0-based) where alignment starts
    uint16_t Bin;                    // BAM (standard) index bin number for this alignment
    uint16_t MapQuality;             // mapping quality score
    uint32_t AlignmentFlag;          // alignment bit-flag (use provided methods to query/modify)
    std::vector<CigarOp> CigarData;  // CIGAR operations for this alignment
    int32_t MateRefID;     // ID number for reference sequence where alignment's mate was aligned
    int32_t MatePosition;  // position (0-based) where alignment's mate starts
    int32_t InsertSize;    // mate-pair insert size
    std::string Filename;  // name of BAM file which this alignment comes from

    //! \internal
    // internal utility methods
private:
    bool FindTag(const std::string& tag, char*& pTagData, const unsigned int& tagDataLength,
                 unsigned int& numBytesParsed) const;
    bool IsValidSize(const std::string& tag, const std::string& type) const;
    void SetErrorString(const std::string& where, const std::string& what) const;
    bool SkipToNextTag(const char storageType, char*& pTagData, unsigned int& numBytesParsed) const;

    //! \internal
    // internal data
private:
    struct BamAlignmentSupportData
    {

        //! \internal
        // data members
        std::string AllCharData;
        uint32_t BlockLength;
        uint32_t NumCigarOperations;
        uint32_t QueryNameLength;
        uint32_t QuerySequenceLength;
        bool HasCoreOnly;

        //! \internal
        // constructor
        BamAlignmentSupportData()
            : BlockLength(0)
            , NumCigarOperations(0)
            , QueryNameLength(0)
            , QuerySequenceLength(0)
            , HasCoreOnly(false)
        {}
    };
    BamAlignmentSupportData SupportData;
    friend class Internal::BamReaderPrivate;
    friend class Internal::BamWriterPrivate;

    mutable std::string ErrorString;  // mutable to allow updates even in logically const methods
}